

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_signparameter.cpp
# Opt level: O1

void __thiscall
SignParameter_OpCodeConstructorTest_Test::~SignParameter_OpCodeConstructorTest_Test
          (SignParameter_OpCodeConstructorTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(SignParameter, OpCodeConstructorTest)
{
  const ByteData expect_bytedata_00("00");
  // constructor
  SignParameter sign_parameter = SignParameter(ScriptOperator::OP_0);
  CompareSignparameter(sign_parameter, expect_bytedata_00,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_00);

  const ByteData expect_bytedata_true("51");
  // constructor
  sign_parameter = SignParameter(ScriptOperator::OP_TRUE);
  CompareSignparameter(sign_parameter, expect_bytedata_true,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_true);

  const ByteData expect_bytedata_msig("ae");
  // constructor
  sign_parameter = SignParameter(ScriptOperator::OP_CHECKMULTISIG);
  CompareSignparameter(sign_parameter, expect_bytedata_msig,
      SignDataType::kOpCode, Pubkey(), false, SigHashType(), expect_bytedata_msig);
}